

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

HRESULT __thiscall Js::SCAPropBag::Get(SCAPropBag *this,LPCWSTR name,Var *pValue)

{
  bool bVar1;
  ScriptContext *scriptContext_00;
  size_t uOperand;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  void *unaff_retaddr;
  InternalString local_c0;
  charcount_t local_b0 [2];
  int len;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  ScriptContext *scriptContext;
  HRESULT hr;
  Var *pValue_local;
  LPCWSTR name_local;
  SCAPropBag *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext_00,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             false,false,false);
  ScriptContext::OnScriptStart(scriptContext_00,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  uOperand = PAL_wcslen(name);
  scriptContext._4_4_ = UIntPtrToInt(uOperand,(INT *)local_b0);
  if (-1 < scriptContext._4_4_) {
    this_00 = Memory::
              RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->m_properties);
    InternalString::InternalString(&local_c0,name,local_b0[0],'\0');
    bVar1 = JsUtil::
            BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<Js::InternalString>(this_00,&local_c0,pValue);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      scriptContext._4_4_ = -0x7fffbffb;
    }
  }
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
  return scriptContext._4_4_;
}

Assistant:

HRESULT SCAPropBag::Get(LPCWSTR name, Var* pValue)
    {
        HRESULT hr = S_OK;
        ScriptContext* scriptContext = GetScriptContext();

        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
        {
            int len;
            IfFailGo(SizeTToInt(wcslen(name), &len));

            if (!m_properties->TryGetValue(InternalString(name, len), pValue))
            {
                hr = E_FAIL;
            }
        }
        END_JS_RUNTIME_CALL(scriptContext);
Error:
        return hr;
    }